

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_chat.cpp
# Opt level: O1

void ShoveChatStr(char *str,BYTE who)

{
  char *__s1;
  undefined8 *puVar1;
  undefined8 *puVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  AInventory *pAVar7;
  undefined8 uVar8;
  int *piVar9;
  ulong uVar10;
  char *tail;
  FString substBuff;
  FString local_48;
  undefined8 *local_40;
  int *local_38;
  
  if (str == (char *)0x0) {
    return;
  }
  if (*str == '\0') {
    return;
  }
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_48.Chars = FString::NullString.Nothing;
  if (((*str == '/') && ((byte)(str[1] | 0x20U) == 0x6d)) && ((byte)(str[2] | 0x20U) == 0x65)) {
    str = str + 3;
    who = who | 2;
  }
  Net_WriteByte('\f');
  Net_WriteByte(who);
  if (chat_substitution.Value == true) {
    lVar5 = (long)consoleplayer;
    puVar1 = *(undefined8 **)(&DAT_017e5f20 + lVar5 * 0x2a0);
    FString::operator=(&local_48,(char *)"");
    pcVar6 = strchr(str,0x24);
    tail = str;
    if (pcVar6 != (char *)0x0) {
      local_40 = &players + lVar5 * 0x54;
      local_38 = &DAT_017e5ee8 + lVar5 * 0xa8;
      do {
        FString::AppendCStrPart(&local_48,tail,(long)pcVar6 - (long)tail);
        cVar3 = pcVar6[1];
        lVar5 = 1;
        while ((cVar3 != '\0' && (iVar4 = isalpha((int)cVar3), iVar4 != 0))) {
          cVar3 = pcVar6[lVar5 + 1];
          lVar5 = lVar5 + 1;
        }
        __s1 = pcVar6 + 1;
        tail = pcVar6 + lVar5;
        switch(lVar5 - 1U) {
        case 0:
          FString::operator+=(&local_48,'$');
          tail = tail + (*tail == '$');
          break;
        default:
          FString::operator+=(&local_48,'$');
          FString::AppendCStrPart(&local_48,__s1,lVar5 - 1U);
          break;
        case 4:
          iVar4 = strncasecmp(__s1,"ammo",4);
          if (iVar4 == 0) {
            pcVar6 = "no ammo";
            if (puVar1 != (undefined8 *)0x0) {
              puVar2 = (undefined8 *)puVar1[0xb0];
              pcVar6 = "no ammo";
              if (puVar2 != (undefined8 *)0x0) {
                if ((*(byte *)(puVar2 + 4) & 0x20) == 0) {
                  if (puVar2[1] == 0) {
                    uVar8 = (**(code **)*puVar2)(puVar2);
                    puVar2[1] = uVar8;
                  }
                  FString::AppendFormat
                            (&local_48,"%s",
                             FName::NameData.NameArray[*(int *)(puVar2[1] + 0xa0)].Text);
                  puVar2 = (undefined8 *)puVar1[0xb1];
                  if (puVar2 != (undefined8 *)0x0) {
                    if ((*(byte *)(puVar2 + 4) & 0x20) != 0) goto LAB_0035e39c;
                    if (puVar2[1] == 0) {
                      uVar8 = (**(code **)*puVar2)(puVar2);
                      puVar2[1] = uVar8;
                    }
                    FString::AppendFormat
                              (&local_48,"/%s",
                               FName::NameData.NameArray[*(int *)(puVar2[1] + 0xa0)].Text);
                  }
                  break;
                }
                puVar1[0xb0] = 0;
                pcVar6 = "no ammo";
              }
            }
LAB_0035e323:
            FString::operator+=(&local_48,pcVar6);
          }
          break;
        case 5:
          iVar4 = strncasecmp(__s1,"armor",5);
          if (iVar4 == 0) {
            pAVar7 = AActor::FindInventory
                               ((AActor *)*local_40,
                                (PClassActor *)ABasicArmor::RegistrationInfo.MyClass,false);
            if (pAVar7 != (AInventory *)0x0) {
              piVar9 = &pAVar7->Amount;
              pcVar6 = "%d";
              goto LAB_0035e372;
            }
            uVar10 = 0;
            pcVar6 = "%d";
LAB_0035e374:
            FString::AppendFormat(&local_48,pcVar6,uVar10);
          }
          break;
        case 6:
          iVar4 = strncasecmp(__s1,"health",6);
          pcVar6 = "%d";
          piVar9 = local_38;
          if (iVar4 == 0) {
LAB_0035e372:
            uVar10 = (ulong)(uint)*piVar9;
            goto LAB_0035e374;
          }
          iVar4 = strncasecmp(__s1,"weapon",6);
          if (iVar4 == 0) {
            pcVar6 = "no weapon";
            if (puVar1 == (undefined8 *)0x0) goto LAB_0035e323;
            if (puVar1[1] == 0) {
              uVar8 = (**(code **)*puVar1)();
              puVar1[1] = uVar8;
            }
            FString::operator+=(&local_48,FName::NameData.NameArray[*(int *)(puVar1[1] + 0xa0)].Text
                               );
          }
          break;
        case 9:
          iVar4 = strncasecmp(__s1,"ammocount",9);
          if (iVar4 == 0) {
            if (puVar1 == (undefined8 *)0x0) {
              FString::operator+=(&local_48,'0');
            }
            else {
              lVar5 = puVar1[0xb0];
              uVar10 = 0;
              if (lVar5 != 0) {
                if ((*(byte *)(lVar5 + 0x20) & 0x20) == 0) {
                  uVar10 = (ulong)*(uint *)(lVar5 + 0x4c8);
                }
                else {
                  puVar1[0xb0] = 0;
                }
              }
              FString::AppendFormat(&local_48,"%d",uVar10);
              lVar5 = puVar1[0xb1];
              if (lVar5 != 0) {
                if ((*(byte *)(lVar5 + 0x20) & 0x20) == 0) {
                  pcVar6 = "/%d";
                  piVar9 = (int *)(lVar5 + 0x4c8);
                  goto LAB_0035e372;
                }
LAB_0035e39c:
                puVar1[0xb1] = 0;
              }
            }
          }
        }
        pcVar6 = strchr(tail,0x24);
      } while (pcVar6 != (char *)0x0);
    }
    if ((tail != str) && (FString::operator+=(&local_48,tail), tail != str)) {
      Net_WriteString(local_48.Chars);
      goto LAB_0035e3d9;
    }
  }
  Net_WriteString(str);
LAB_0035e3d9:
  FString::~FString(&local_48);
  return;
}

Assistant:

static void ShoveChatStr (const char *str, BYTE who)
{
	// Don't send empty messages
	if (str == NULL || str[0] == '\0')
		return;

	FString substBuff;

	if (str[0] == '/' &&
		(str[1] == 'm' || str[1] == 'M') &&
		(str[2] == 'e' || str[2] == 'E'))
	{ // This is a /me message
		str += 3;
		who |= 2;
	}

	Net_WriteByte (DEM_SAY);
	Net_WriteByte (who);

	if (!chat_substitution || !DoSubstitution (substBuff, str))
	{
		Net_WriteString (str);
	}
	else
	{
		Net_WriteString (substBuff);
	}
}